

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

void internalSubsetTokenizer(void *ctx,xmlChar *name,xmlChar *publicId,xmlChar *systemId)

{
  long lVar1;
  
  lVar1 = *(long *)((long)ctx + 0x1a8);
  if (*(int *)(lVar1 + 4) != 0) {
    fputc(10,(FILE *)SAXdebug);
    *(undefined4 *)(lVar1 + 4) = 0;
  }
  if (name == (xmlChar *)0x0) {
    name = (xmlChar *)"<none>";
  }
  if (publicId == (xmlChar *)0x0) {
    publicId = (xmlChar *)"<none>";
  }
  if (systemId == (xmlChar *)0x0) {
    systemId = (xmlChar *)"<none>";
  }
  fprintf((FILE *)SAXdebug,"DOCTYPE\n%s\n%s\n%s\n",name,publicId,systemId);
  return;
}

Assistant:

static void
internalSubsetTokenizer(void *ctx, const xmlChar *name,
                        const xmlChar *publicId, const xmlChar *systemId) {
    xmlParserCtxtPtr ctxt = ctx;
    xmlTokenizerConfig *config = ctxt->_private;

    pendingTokenizer(config);

    fprintf(SAXdebug, "DOCTYPE\n%s\n%s\n%s\n",
            name ? name : BAD_CAST "<none>",
            publicId ? publicId : BAD_CAST "<none>",
            systemId ? systemId : BAD_CAST "<none>");
}